

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

uchar FSE_decodeSymbolFast(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD)

{
  undefined4 uVar1;
  size_t sVar2;
  long *in_RDI;
  size_t lowBits;
  BYTE symbol;
  U32 nbBits;
  FSE_decode_t DInfo;
  undefined8 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  ushort local_14;
  uchar uStack_12;
  
  uVar1 = *(undefined4 *)(in_RDI[1] + *in_RDI * 4);
  uStack_12 = (uchar)((uint)uVar1 >> 0x10);
  sVar2 = BIT_readBitsFast((BIT_DStream_t *)CONCAT17(uStack_12,in_stack_ffffffffffffffe0),
                           (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  local_14 = (ushort)uVar1;
  *in_RDI = local_14 + sVar2;
  return uStack_12;
}

Assistant:

MEM_STATIC BYTE FSE_decodeSymbolFast(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD)
{
    FSE_decode_t const DInfo = ((const FSE_decode_t*)(DStatePtr->table))[DStatePtr->state];
    U32 const nbBits = DInfo.nbBits;
    BYTE const symbol = DInfo.symbol;
    size_t const lowBits = BIT_readBitsFast(bitD, nbBits);

    DStatePtr->state = DInfo.newState + lowBits;
    return symbol;
}